

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa_pss.cc
# Opt level: O3

EVP_MD * rsa_algor_to_md(X509_ALGOR *alg)

{
  int iVar1;
  EVP_MD *md;
  int line;
  
  if (alg == (X509_ALGOR *)0x0) {
    line = 0x80;
  }
  else {
    md = (EVP_MD *)EVP_get_digestbyobj(alg->algorithm);
    line = 0x85;
    if ((md != (EVP_MD *)0x0) && (iVar1 = EVP_MD_type(md), iVar1 - 0x2a0U < 3)) {
      return (EVP_MD *)md;
    }
  }
  ERR_put_error(0xb,0,0x70,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/rsa_pss.cc"
                ,line);
  return (EVP_MD *)0x0;
}

Assistant:

static const EVP_MD *rsa_algor_to_md(const X509_ALGOR *alg) {
  if (!alg) {
    // If omitted, PSS defaults to SHA-1, which we do not allow.
    OPENSSL_PUT_ERROR(X509, X509_R_INVALID_PSS_PARAMETERS);
    return NULL;
  }
  const EVP_MD *md = EVP_get_digestbyobj(alg->algorithm);
  if (md == NULL || !is_allowed_pss_md(md)) {
    OPENSSL_PUT_ERROR(X509, X509_R_INVALID_PSS_PARAMETERS);
    return NULL;
  }
  return md;
}